

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
* __thiscall
RandomizerWorld::item_names_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           *__return_storage_ptr__,RandomizerWorld *this,bool strict)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type *ppIVar3;
  mapped_type *pmVar4;
  int iVar5;
  mapped_type local_79 [9];
  key_type local_70 [2];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar5 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_70[0].field_2;
  do {
    local_79[0] = (mapped_type)iVar5;
    ppIVar3 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this,local_79);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,&(*ppIVar3)->_name);
    *pmVar4 = (mapped_type)iVar5;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x45);
  if (!strict) {
    local_70[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Kazalt Jewel","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,local_70);
    *pmVar4 = '(';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
    }
    local_70[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Yellow Jewel","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,local_70);
    *pmVar4 = '\"';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
    }
    local_70[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Blue Jewel","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,local_70);
    *pmVar4 = '!';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
    }
    local_70[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Green Jewel","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
             ::operator[](__return_storage_ptr__,local_70);
    *pmVar4 = '4';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, uint8_t> RandomizerWorld::item_names(bool strict) const
{
    // Add factual item names from the world data
    std::map<std::string, uint8_t> item_names;
    for(uint8_t i=0 ; i<ITEM_COUNT ; ++i)
    {
        try
        {
            item_names[this->item(i)->name()] = i;
        }
        catch(std::out_of_range&)
        {
            item_names["No" + std::to_string(i)] = i;
        }
    }

    // Add alternative names which depend on settings unless we are in "strict" mode
    if(!strict)
    {
        item_names["Kazalt Jewel"] = ITEM_RED_JEWEL;
        item_names["Yellow Jewel"] = ITEM_YELLOW_JEWEL;
        item_names["Blue Jewel"] = ITEM_BLUE_JEWEL;
        item_names["Green Jewel"] = ITEM_GREEN_JEWEL;
    }

    return item_names;
}